

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluator.cxx
# Opt level: O0

string * __thiscall
GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
          (string *__return_storage_ptr__,GeneratorExpressionContent *this)

{
  char *pcVar1;
  ulong uVar2;
  allocator local_19;
  GeneratorExpressionContent *local_18;
  GeneratorExpressionContent *this_local;
  
  pcVar1 = this->StartContent;
  uVar2 = this->ContentLength;
  local_18 = this;
  this_local = (GeneratorExpressionContent *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,uVar2,&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratorExpressionContent::GetOriginalExpression() const
{
  return std::string(this->StartContent, this->ContentLength);
}